

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeModImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint imm;
  uint cmode;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  uVar1 = fieldFromInstruction(insn,0xc,4);
  uVar2 = fieldFromInstruction(insn,0x10,3);
  uVar3 = fieldFromInstruction(insn,5,5);
  uVar4 = MCInst_getOpcode(Inst);
  if (uVar4 == 0x448) {
    DecodeFPR64RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  else {
    DecodeVectorRegisterClass(Inst,RegNo,Addr,Decoder);
  }
  MCOperand_CreateImm0(Inst,(ulong)(uVar3 | uVar2 << 5));
  uVar4 = MCInst_getOpcode(Inst);
  if (uVar4 != 1099) {
    if (uVar4 == 0x44c) {
LAB_001a626a:
      iVar5 = 0x108;
      if ((uVar1 & 1) != 0) {
        iVar5 = 0x110;
      }
      MCOperand_CreateImm0(Inst,(long)iVar5);
      return MCDisassembler_Success;
    }
    if (1 < uVar4 - 0x44d) {
      if (uVar4 == 0x44f) goto LAB_001a626a;
      if ((uVar4 != 0x451) && (uVar4 != 0x46f)) {
        if (uVar4 == 0x470) goto LAB_001a626a;
        if (1 < uVar4 - 0x471) {
          if (uVar4 == 0x473) goto LAB_001a626a;
          if (uVar4 != 0x474) {
            return MCDisassembler_Success;
          }
        }
      }
    }
  }
  MCOperand_CreateImm0(Inst,(ulong)((uVar1 & 6) << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeModImmInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned cmode = fieldFromInstruction(insn, 12, 4);
	unsigned imm = fieldFromInstruction(insn, 16, 3) << 5;
	imm |= fieldFromInstruction(insn, 5, 5);

	if (MCInst_getOpcode(Inst) == AArch64_MOVID)
		DecodeFPR64RegisterClass(Inst, Rd, Addr, Decoder);
	else
		DecodeVectorRegisterClass(Inst, Rd, Addr, Decoder);

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		default:
			break;
		case AArch64_MOVIv4i16:
		case AArch64_MOVIv8i16:
		case AArch64_MVNIv4i16:
		case AArch64_MVNIv8i16:
		case AArch64_MOVIv2i32:
		case AArch64_MOVIv4i32:
		case AArch64_MVNIv2i32:
		case AArch64_MVNIv4i32:
			MCOperand_CreateImm0(Inst, (cmode & 6) << 2);
			break;
		case AArch64_MOVIv2s_msl:
		case AArch64_MOVIv4s_msl:
		case AArch64_MVNIv2s_msl:
		case AArch64_MVNIv4s_msl:
			MCOperand_CreateImm0(Inst, cmode & 1 ? 0x110 : 0x108);
			break;
	}

	return Success;
}